

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O3

QPDFObjectHandle __thiscall QPDFOutlineObjectHelper::getDestPage(QPDFOutlineObjectHelper *this)

{
  bool bVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  QPDFObjectHandle QVar4;
  QPDFObjectHandle dest;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  getDest((QPDFOutlineObjectHelper *)&stack0xffffffffffffffe0);
  bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&stack0xffffffffffffffe0);
  if (bVar1) {
    iVar2 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)&stack0xffffffffffffffe0);
    if (0 < iVar2) {
      QVar4 = QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)this,(int)&stack0xffffffffffffffe0)
      ;
      _Var3._M_pi = QVar4.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_001d0c4c;
    }
  }
  QVar4 = QPDFObjectHandle::newNull();
  _Var3._M_pi = QVar4.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
LAB_001d0c4c:
  if ((element_type *)local_18._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    _Var3._M_pi = extraout_RDX;
  }
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFOutlineObjectHelper::getDestPage()
{
    QPDFObjectHandle dest = getDest();
    if ((dest.isArray()) && (dest.getArrayNItems() > 0)) {
        return dest.getArrayItem(0);
    }
    return QPDFObjectHandle::newNull();
}